

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uinvchar.cpp
# Opt level: O3

void u_UCharsToChars_63(UChar *us,char *cs,int32_t length)

{
  long lVar1;
  int iVar2;
  UChar UVar3;
  
  if (0 < length) {
    iVar2 = length + 1;
    lVar1 = 0;
    do {
      UVar3 = us[lVar1];
      if ((0x7f < (ushort)UVar3) ||
         ((invariantChars[(ushort)UVar3 >> 5] >> ((ushort)UVar3 & 0x1f) & 1) == 0)) {
        UVar3 = L'\0';
      }
      cs[lVar1] = (char)UVar3;
      iVar2 = iVar2 + -1;
      lVar1 = lVar1 + 1;
    } while (1 < iVar2);
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
u_UCharsToChars(const UChar *us, char *cs, int32_t length) {
    UChar u;

    while(length>0) {
        u=*us++;
        if(!UCHAR_IS_INVARIANT(u)) {
            U_ASSERT(FALSE); /* Variant characters were used. These are not portable in ICU. */
            u=0;
        }
        *cs++=(char)UCHAR_TO_CHAR(u);
        --length;
    }
}